

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O1

void vkt::sr::anon_unknown_0::MatrixCaseUtils::Evaluator<0,_13,_1>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  int i;
  float *pfVar1;
  long lVar2;
  undefined4 *puVar3;
  long lVar4;
  long lVar5;
  float scalar;
  undefined4 uVar6;
  Vector<float,_3> res_1;
  Vector<float,_3> res_2;
  Vector<float,_3> res;
  Type in0;
  Vec4 *local_100;
  ulong local_f8;
  float local_f0 [6];
  float local_d8 [4];
  float local_c8 [6];
  float local_b0 [3];
  float local_a4 [3];
  Matrix<float,_4,_4> local_98;
  Matrix<float,_4,_4> local_50;
  
  pfVar1 = (float *)&local_98;
  if (in0Type == INPUTTYPE_DYNAMIC) {
    lVar2 = 0;
    lVar4 = 0;
    do {
      lVar5 = 0;
      do {
        uVar6 = 0x3f800000;
        if (lVar2 != lVar5) {
          uVar6 = 0;
        }
        *(undefined4 *)((long)pfVar1 + lVar5) = uVar6;
        lVar5 = lVar5 + 0x10;
      } while (lVar5 != 0x40);
      lVar4 = lVar4 + 1;
      pfVar1 = pfVar1 + 1;
      lVar2 = lVar2 + 0x10;
    } while (lVar4 != 4);
    local_98.m_data.m_data[0].m_data._0_8_ = *(undefined8 *)evalCtx->in[0].m_data;
    local_98.m_data.m_data[0].m_data._8_8_ = *(undefined8 *)(evalCtx->in[0].m_data + 2);
    local_98.m_data.m_data[1].m_data._0_8_ = *(undefined8 *)evalCtx->in[1].m_data;
    local_98.m_data.m_data[1].m_data._8_8_ = *(undefined8 *)(evalCtx->in[1].m_data + 2);
    local_98.m_data.m_data[2].m_data._0_8_ = *(undefined8 *)evalCtx->in[2].m_data;
    local_98.m_data.m_data[2].m_data._8_8_ = *(undefined8 *)(evalCtx->in[2].m_data + 2);
    local_98.m_data.m_data[3].m_data._0_8_ = *(undefined8 *)evalCtx->in[3].m_data;
    local_98.m_data.m_data[3].m_data._8_8_ = *(undefined8 *)(evalCtx->in[3].m_data + 2);
  }
  else {
    local_98.m_data.m_data[3].m_data[0] = 0.0;
    local_98.m_data.m_data[3].m_data[1] = 0.0;
    local_98.m_data.m_data[3].m_data[2] = 0.0;
    local_98.m_data.m_data[3].m_data[3] = 0.0;
    local_98.m_data.m_data[2].m_data[0] = 0.0;
    local_98.m_data.m_data[2].m_data[1] = 0.0;
    local_98.m_data.m_data[2].m_data[2] = 0.0;
    local_98.m_data.m_data[2].m_data[3] = 0.0;
    local_98.m_data.m_data[1].m_data[0] = 0.0;
    local_98.m_data.m_data[1].m_data[1] = 0.0;
    local_98.m_data.m_data[1].m_data[2] = 0.0;
    local_98.m_data.m_data[1].m_data[3] = 0.0;
    local_98.m_data.m_data[0].m_data[0] = 0.0;
    local_98.m_data.m_data[0].m_data[1] = 0.0;
    local_98.m_data.m_data[0].m_data[2] = 0.0;
    local_98.m_data.m_data[0].m_data[3] = 0.0;
    puVar3 = &sr::(anonymous_namespace)::s_constInMat4x4;
    lVar2 = 0;
    do {
      lVar4 = 0;
      do {
        pfVar1[lVar4] = *(float *)((long)puVar3 + lVar4);
        lVar4 = lVar4 + 4;
      } while (lVar4 != 0x10);
      lVar2 = lVar2 + 1;
      pfVar1 = pfVar1 + 1;
      puVar3 = puVar3 + 4;
    } while (lVar2 != 4);
  }
  if (in1Type == INPUTTYPE_DYNAMIC) {
    scalar = (evalCtx->coords).m_data[0];
  }
  else {
    scalar = -0.2;
  }
  tcu::operator+(&local_50,&local_98,scalar);
  local_a4[0] = local_50.m_data.m_data[0].m_data[0];
  local_a4[1] = local_50.m_data.m_data[0].m_data[1];
  local_a4[2] = local_50.m_data.m_data[0].m_data[2];
  local_b0[0] = local_50.m_data.m_data[1].m_data[1];
  local_b0[1] = local_50.m_data.m_data[1].m_data[2];
  local_b0[2] = local_50.m_data.m_data[1].m_data[3];
  local_d8[0] = 0.0;
  local_d8[1] = 0.0;
  local_d8[2] = 0.0;
  lVar2 = 0;
  do {
    local_d8[lVar2] = local_c8[lVar2 + 9] + local_c8[lVar2 + 6];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  local_c8[3] = local_50.m_data.m_data[2].m_data[2];
  local_c8[4] = local_50.m_data.m_data[2].m_data[3];
  local_c8[5] = local_50.m_data.m_data[2].m_data[0];
  local_100 = (Vec4 *)0x0;
  local_f8 = local_f8 & 0xffffffff00000000;
  lVar2 = 0;
  do {
    *(float *)((long)&local_100 + lVar2 * 4) = local_d8[lVar2] + local_c8[lVar2 + 3];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  local_c8[0] = local_50.m_data.m_data[3].m_data[3];
  local_c8[1] = local_50.m_data.m_data[3].m_data[0];
  local_c8[2] = local_50.m_data.m_data[3].m_data[1];
  local_f0[2] = 0.0;
  local_f0[3] = 0.0;
  local_f0[4] = 0.0;
  lVar2 = 0;
  do {
    local_f0[lVar2 + 2] = *(float *)((long)&local_100 + lVar2 * 4) + local_c8[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  local_100 = &evalCtx->color;
  local_f8 = 0x100000000;
  local_f0[0] = 2.8026e-45;
  lVar2 = 2;
  do {
    (evalCtx->color).m_data[*(int *)((long)&local_100 + lVar2 * 4)] = local_f0[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(in0 + in1);
	}